

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_fragment.cpp
# Opt level: O1

void __thiscall
ImportFragment_BadInternalFixupTargetSection_Test::TestBody
          (ImportFragment_BadInternalFixupTargetSection_Test *this)

{
  undefined1 auVar1 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  parser<pstore::exchange::import_ns::callbacks> *this_00;
  char *message;
  char *in_R9;
  pointer *__ptr;
  error_code eVar3;
  mock_mutex mutex;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> input;
  transaction<std::unique_lock<mock_mutex>_> transaction;
  parser<pstore::exchange::import_ns::callbacks> parser;
  digest fragment_digest;
  string_mapping imported_names;
  AssertHelper local_210;
  undefined1 local_201;
  undefined1 local_200 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1f8;
  undefined1 local_1f0 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e0;
  AssertHelper local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1c8;
  singleton_storage<pstore::exchange::import_ns::callbacks> *local_1c0;
  undefined1 local_1b8 [16];
  transaction<std::unique_lock<mock_mutex>_> local_1a8;
  undefined1 local_170 [8];
  bool local_168 [80];
  error_code local_118;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_100;
  _Alloc_hider local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  uint128 local_c8;
  string_mapping local_b8;
  
  local_1c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8;
  local_170 = (undefined1  [8])0x8b;
  pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::__cxx11::string::_M_create((ulong *)&local_1c8,(ulong)local_170);
  auVar1 = local_170;
  local_1b8._0_8_ = local_170;
  local_1c8 = pbVar2;
  memcpy(pbVar2,
         "{\n        \"text\": {\n            \"data\":\"\",\n            \"ifixups\":[ { \"section\":\"data\", \"type\":1, \"offset\":0, \"addend\":0 } ]\n        }\n    }"
         ,0x8b);
  local_1c0 = (singleton_storage<pstore::exchange::import_ns::callbacks> *)auVar1;
  ((type *)auVar1)->__data[(long)&pbVar2->_M_dataplus] = '\0';
  local_170 = (undefined1  [8])&local_201;
  local_168[0] = false;
  std::unique_lock<mock_mutex>::lock((unique_lock<mock_mutex> *)local_170);
  local_168[0] = true;
  pstore::transaction<std::unique_lock<mock_mutex>_>::transaction
            (&local_1a8,&(this->super_ImportFragment).import_db_,(lock_type *)local_170);
  if ((local_168[0] == true) &&
     ((_Head_base<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_false>
       )local_170 !=
      (_Head_base<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_false>
       )0x0)) {
    local_168[0] = false;
  }
  local_c8.v_._0_8_ = 0x11111111;
  local_c8.v_._8_8_ = 0x11111111;
  local_b8.strings_.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_b8.strings_;
  local_b8.adder_.views_.
  super__Vector_base<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8.adder_.views_.
  super__Vector_base<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.adder_.views_.
  super__Vector_base<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.strings_.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = 0;
  local_b8.views_.
  super__List_base<pstore::sstring_view<const_char_*>,_std::allocator<pstore::sstring_view<const_char_*>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_b8.views_;
  local_b8.views_.
  super__List_base<pstore::sstring_view<const_char_*>,_std::allocator<pstore::sstring_view<const_char_*>_>_>
  ._M_impl._M_node._M_size = 0;
  local_b8.lookup_._M_h._M_buckets = &local_b8.lookup_._M_h._M_single_bucket;
  local_b8.lookup_._M_h._M_bucket_count = 1;
  local_b8.lookup_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_b8.lookup_._M_h._M_element_count = 0;
  local_b8.lookup_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_b8.lookup_._M_h._M_rehash_policy._M_next_resize = 0;
  local_b8.lookup_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_210.data_ = (AssertHelperData *)local_1a8.super_transaction_base.db_;
  local_b8.strings_.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       local_b8.strings_.
       super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  local_b8.views_.
  super__List_base<pstore::sstring_view<const_char_*>,_std::allocator<pstore::sstring_view<const_char_*>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       local_b8.views_.
       super__List_base<pstore::sstring_view<const_char_*>,_std::allocator<pstore::sstring_view<const_char_*>_>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  pstore::gsl::not_null<pstore::database_*>::ensure_invariant
            ((not_null<pstore::database_*> *)&local_210);
  pstore::exchange::import_ns::callbacks::
  make<pstore::exchange::import_ns::object_rule<pstore::exchange::import_ns::fragment_sections,pstore::transaction<std::unique_lock<mock_mutex>>*,pstore::exchange::import_ns::string_mapping*,pstore::uint128_const*>,pstore::transaction<std::unique_lock<mock_mutex>>*,pstore::exchange::import_ns::string_mapping*,pstore::uint128_const*>
            ((callbacks *)local_200,(not_null<pstore::database_*>)local_210.data_,&local_1a8,
             &local_b8,&local_c8);
  local_1f0 = (undefined1  [8])CONCAT44(local_200._4_4_,local_200._0_4_);
  local_1e8._M_pi = local_1f8._M_pi;
  if (local_1f8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_1f8._M_pi)->_M_use_count = (local_1f8._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_1f8._M_pi)->_M_use_count = (local_1f8._M_pi)->_M_use_count + 1;
    }
  }
  pstore::json::parser<pstore::exchange::import_ns::callbacks>::parser
            ((parser<pstore::exchange::import_ns::callbacks> *)local_170,(callbacks *)local_1f0,none
            );
  if (local_1e8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1e8._M_pi);
  }
  if (local_1f8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1f8._M_pi);
  }
  pbVar2 = local_1c8;
  pstore::gsl::details::extent_type<-1L>::extent_type
            ((extent_type<_1L> *)local_1f0,(index_type)local_1c0);
  local_1e8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pbVar2;
  this_00 = pstore::json::parser<pstore::exchange::import_ns::callbacks>::
            input<pstore::gsl::span<char_const,_1l>>
                      ((parser<pstore::exchange::import_ns::callbacks> *)local_170,
                       (span<const_char,__1L> *)local_1f0);
  pstore::json::parser<pstore::exchange::import_ns::callbacks>::eof(this_00);
  local_200[0] = local_118._M_value != 0;
  local_1f8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (local_118._M_value == 0) {
    testing::Message::Message((Message *)&local_210);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1f0,(internal *)local_200,(AssertionResult *)0x1df922,"false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_1d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_fragment.cpp"
               ,0x54,(char *)local_1f0);
    testing::internal::AssertHelper::operator=(&local_1d0,(Message *)&local_210);
    testing::internal::AssertHelper::~AssertHelper(&local_1d0);
    if (local_1f0 != (undefined1  [8])&local_1e0) {
      operator_delete((void *)local_1f0,local_1e0._M_allocated_capacity + 1);
    }
    if ((database *)local_210.data_ != (database *)0x0) {
      (**(code **)(*(long *)local_210.data_ + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_1f8._M_pi);
  }
  eVar3 = pstore::exchange::import_ns::make_error_code(internal_fixup_target_not_found);
  local_1f8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)eVar3._M_cat;
  local_200._0_4_ = eVar3._M_value;
  testing::internal::CmpHelperEQ<std::error_code,std::error_code>
            ((internal *)local_1f0,"parser.last_error ()",
             "make_error_code (error::internal_fixup_target_not_found)",&local_118,
             (error_code *)local_200);
  if (local_1f0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_200);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((_Alloc_hider *)&(local_1e8._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_210,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_fragment.cpp"
               ,0x55,message);
    testing::internal::AssertHelper::operator=(&local_210,(Message *)local_200);
    testing::internal::AssertHelper::~AssertHelper(&local_210);
    if ((long *)CONCAT44(local_200._4_4_,local_200._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_200._4_4_,local_200._0_4_) + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1e8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_1e8._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_p != &local_e0) {
    operator_delete(local_f0._M_p,local_e0._M_allocated_capacity + 1);
  }
  if (local_100._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_100._M_pi);
  }
  std::
  deque<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>
  ::~deque((deque<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>
            *)local_168);
  if (local_170 != (undefined1  [8])0x0) {
    operator_delete((void *)local_170,0x68);
  }
  pstore::exchange::import_ns::string_mapping::~string_mapping(&local_b8);
  local_1a8.super_transaction_base._vptr_transaction_base = (_func_int **)&PTR__transaction_0023bdb8
  ;
  pstore::transaction_base::rollback(&local_1a8.super_transaction_base);
  if ((local_1a8.lock_._M_owns == true) && (local_1a8.lock_._M_device != (mutex_type *)0x0)) {
    local_1a8.lock_._M_owns = false;
  }
  if (local_1c8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8) {
    operator_delete(local_1c8,(ulong)(local_1b8._0_8_ + 1));
  }
  return;
}

Assistant:

TEST_F (ImportFragment, BadInternalFixupTargetSection) {
    using namespace pstore::exchange::import_ns;

    // This fragment contains a text section only but it has an internal fixup that targets the
    // data section. The fragment should be rejected.
    auto const input = R"({
        "text": {
            "data":"",
            "ifixups":[ { "section":"data", "type":1, "offset":0, "addend":0 } ]
        }
    })"s;

    mock_mutex mutex;
    auto transaction = begin (import_db_, transaction_lock{mutex});

    constexpr pstore::index::digest fragment_digest{0x11111111, 0x11111111};
    string_mapping imported_names;

    auto parser = import_fragment_parser (&transaction, &imported_names, &fragment_digest);
    parser.input (input).eof ();
    EXPECT_TRUE (parser.has_error ());
    EXPECT_EQ (parser.last_error (), make_error_code (error::internal_fixup_target_not_found));
}